

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

size_t __thiscall
Memory::LargeHeapBlock::Rescan
          (LargeHeapBlock *this,Recycler *recycler,bool isPartialSwept,RescanFlags flags)

{
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  size_t sVar6;
  RescanFlags flags_local;
  bool isPartialSwept_local;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  this->lastCollectAllocCount = this->allocCount;
  CVar3 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&recycler->collectionState);
  if ((CVar3 == CollectionStateConcurrentFinishMark) &&
     ((flags & RescanFlags_ResetWriteWatch) == RescanFlags_None)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x551,
                       "(recycler->collectionState != CollectionStateConcurrentFinishMark || (flags & RescanFlags_ResetWriteWatch))"
                       ,
                       "recycler->collectionState != CollectionStateConcurrentFinishMark || (flags & RescanFlags_ResetWriteWatch)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  sVar6 = GetPageCount(this);
  if (sVar6 == 1) {
    bVar2 = RescanOnePage(this,recycler,flags);
    this_local = (LargeHeapBlock *)(ulong)bVar2;
  }
  else {
    CVar3 = ObservableValue::operator_cast_to_CollectionState
                      ((ObservableValue *)&recycler->collectionState);
    if ((CVar3 != CollectionStateConcurrentFinishMark) &&
       (BVar4 = Recycler::IsConcurrentMarkState(recycler), BVar4 != 0)) {
      return 0;
    }
    this_local = (LargeHeapBlock *)RescanMultiPage(this,recycler,flags);
  }
  return (size_t)this_local;
}

Assistant:

size_t
LargeHeapBlock::Rescan(Recycler * recycler, bool isPartialSwept, RescanFlags flags)
{
    // Update the lastCollectAllocCount for sweep
    this->lastCollectAllocCount = this->allocCount;

#if ENABLE_CONCURRENT_GC
    Assert(recycler->collectionState != CollectionStateConcurrentFinishMark || (flags & RescanFlags_ResetWriteWatch));
    if (this->GetPageCount() == 1)
    {
        return RescanOnePage(recycler, flags);
    }

    // Need to rescan for finish mark even if it is done on the background thread
    if (recycler->collectionState != CollectionStateConcurrentFinishMark && recycler->IsConcurrentMarkState())
    {
        // CONCURRENT-TODO: Don't do background rescan for pages with multiple pages because
        // we don't track which page we have queued up
        return 0;
    }
    return RescanMultiPage(recycler, flags);
#else
    return this->GetPageCount() == 1 ? RescanOnePage(recycler) : RescanMultiPage(recycler);
#endif
}